

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

void * mwRealloc(void *p,size_t size,char *file,int line)

{
  int iVar1;
  int iVar2;
  mwData *mw_00;
  void *__dest;
  char *ptr;
  mwData *mw;
  int i;
  int oldUseLimit;
  int line_local;
  char *file_local;
  size_t size_local;
  void *p_local;
  
  mwAutoInit();
  if (p == (void *)0x0) {
    p_local = mwMalloc(size,file,line);
  }
  else if (size == 0) {
    mwFree(p,file,line);
    p_local = (void *)0x0;
  }
  else {
    mw_00 = (mwData *)((long)p + (-(long)mwOverflowZoneSize - (long)mwDataSize));
    iVar2 = mwIsOwned(mw_00,file,line);
    iVar1 = mwUseLimit;
    if (iVar2 != 0) {
      if ((mw_00->flag & 1) == 0) {
        if ((mwUseLimit != 0) && (mwAllocLimit < (long)((size + mwStatCurAlloc) - mw_00->size))) {
          if (mwTestAlways != 0) {
            mwTestNow(file,line,1);
          }
          mwCounter = mwCounter + 1;
          mwWrite("limit fail: <%ld> %s(%d), %ld wanted %ld available\n",mwCounter,file,
                  (ulong)(uint)line,size - mw_00->size,mwAllocLimit - mwStatCurAlloc);
          mwIncErr();
          mwFlush();
          return (void *)0x0;
        }
        mwUseLimit = 0;
        __dest = mwMalloc(size,file,line);
        if (__dest == (void *)0x0) {
          mwUseLimit = iVar1;
          return (void *)0x0;
        }
        if (size < mw_00->size) {
          memcpy(__dest,p,size);
        }
        else {
          memcpy(__dest,p,mw_00->size);
        }
        mwFree(p,file,line);
        mwUseLimit = iVar1;
        return __dest;
      }
      mwIncErr();
      if (*(char *)((long)&mw_00->prev + (long)mwOverflowZoneSize + (long)mwDataSize) != -4) {
        mwWrite("internal: <%ld> %s(%d), no-mans-land MW-%p is corrupted\n",mwCounter,file,
                (ulong)(uint)line,mw_00);
      }
    }
    for (mw._4_4_ = 0; mw._4_4_ < 0x40; mw._4_4_ = mw._4_4_ + 1) {
      if (mwLastFree[mw._4_4_] == p) {
        mwIncErr();
        mwWrite("realloc: <%ld> %s(%d), %p was freed from %s(%d)\n",mwCounter,file,(ulong)(uint)line
                ,p,mwLFfile[mw._4_4_],mwLFline[mw._4_4_]);
        mwFlush();
        return (void *)0x0;
      }
    }
    mwIncErr();
    mwWrite("realloc: <%ld> %s(%d), unknown pointer %p\n",mwCounter,file,(ulong)(uint)line,p);
    mwFlush();
    p_local = (void *)0x0;
  }
  return p_local;
}

Assistant:

void *mwRealloc(void *p, size_t size, const char *file, int line)
{
	int oldUseLimit, i;
	mwData *mw;
	char *ptr;

	mwAutoInit();

	if (p == NULL) {
		return mwMalloc(size, file, line);
	}
	if (size == 0) {
		mwFree(p, file, line);
		return NULL;
	}

	MW_MUTEX_LOCK();

	/* do the quick ownership test */
	mw = (mwData *) mwBUFFER_TO_MW(p);
	if (mwIsOwned(mw, file, line)) {

		/* if the buffer is an NML, treat this as a double-free */
		if (mw->flag & MW_NML) {
			mwIncErr();
			if (*((unsigned char *)(mw) + mwDataSize + mwOverflowZoneSize) != MW_VAL_NML) {
				mwWrite("internal: <%ld> %s(%d), no-mans-land MW-%p is corrupted\n",
						mwCounter, file, line, mw);
			}
			goto check_dbl_free;
		}

		/* if this allocation would violate the limit, fail it */
		if (mwUseLimit && ((long)size + mwStatCurAlloc - (long)mw->size > mwAllocLimit)) {
			TESTS(file, line);
			mwCounter ++;
			mwWrite("limit fail: <%ld> %s(%d), %ld wanted %ld available\n",
					mwCounter, file, line, (unsigned long)size - mw->size, mwAllocLimit - mwStatCurAlloc);
			mwIncErr();
			FLUSH();
			MW_MUTEX_UNLOCK();
			return NULL;
		}

		/* fake realloc operation */
		oldUseLimit = mwUseLimit;
		mwUseLimit = 0;
		ptr = (char *) mwMalloc(size, file, line);
		if (ptr != NULL) {
			if (size < mw->size) {
				memcpy(ptr, p, size);
			} else {
				memcpy(ptr, p, mw->size);
			}
			mwFree(p, file, line);
		}
		mwUseLimit = oldUseLimit;
		MW_MUTEX_UNLOCK();
		return (void *) ptr;
	}

	/* Unknown pointer! */

	/* using free'd pointer? */
check_dbl_free:
	for (i = 0; i < MW_FREE_LIST; i++) {
		if (mwLastFree[i] == p) {
			mwIncErr();
			mwWrite("realloc: <%ld> %s(%d), %p was"
					" freed from %s(%d)\n",
					mwCounter, file, line, p,
					mwLFfile[i], mwLFline[i]);
			FLUSH();
			MW_MUTEX_UNLOCK();
			return NULL;
		}
	}

	/* some weird pointer */
	mwIncErr();
	mwWrite("realloc: <%ld> %s(%d), unknown pointer %p\n",
			mwCounter, file, line, p);
	FLUSH();
	MW_MUTEX_UNLOCK();
	return NULL;
}